

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

size_t Catch::listTests(Config *config)

{
  pointer *this;
  pointer pTVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestSpecParser *this_00;
  IRegistryHub *pIVar3;
  undefined4 extraout_var_01;
  ostream *poVar4;
  undefined4 extraout_var_02;
  pointer pcVar5;
  undefined1 _str [8];
  undefined1 local_148 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  pointer local_110;
  pointer pbStack_108;
  pointer local_100;
  pointer pbStack_f8;
  pointer local_f0;
  pointer pFStack_e8;
  TagAliasRegistry *local_e0;
  undefined1 local_d8 [8];
  TestSpec testSpec;
  undefined1 local_98 [32];
  undefined1 auStack_78 [8];
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  Colour local_58 [8];
  Colour colourGuard;
  allocator local_31;
  
  iVar2 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])();
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
            ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)local_d8,
             (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
             CONCAT44(extraout_var,iVar2));
  iVar2 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])(config);
  if (*(long *)CONCAT44(extraout_var_00,iVar2) == ((long *)CONCAT44(extraout_var_00,iVar2))[1]) {
    std::operator<<((ostream *)&std::cout,"All available test cases:\n");
    TagAliasRegistry::get();
    local_130._M_allocated_capacity = (size_type)&local_120;
    local_130._8_8_ = 0;
    local_120._M_local_buf[0] = '\0';
    local_110 = (pointer)0x0;
    pbStack_108 = (pointer)0x0;
    local_100 = (pointer)0x0;
    pbStack_f8 = (pointer)0x0;
    local_f0 = (pointer)0x0;
    pFStack_e8 = (pointer)0x0;
    local_e0 = &TagAliasRegistry::get::instance;
    std::__cxx11::string::string((string *)local_98,"*",(allocator *)local_58);
    this_00 = TestSpecParser::parse((TestSpecParser *)local_148,(string *)local_98);
    TestSpecParser::testSpec
              ((TestSpec *)
               &testSpec.m_filters.
                super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,this_00);
    this = &testSpec.m_filters.
            super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::_M_move_assign
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)local_d8
               ,this);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)this);
    std::__cxx11::string::~string((string *)local_98);
    TestSpecParser::~TestSpecParser((TestSpecParser *)local_148);
  }
  else {
    std::operator<<((ostream *)&std::cout,"Matching test cases:\n");
  }
  local_98._16_8_ = 0x4f;
  testSpec.m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0xffffffffffffffff;
  local_98[0x18] = '\t';
  local_98._0_8_ = (pointer)0x2;
  local_98._8_8_ = 4;
  auStack_78 = (undefined1  [8])0x0;
  matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pIVar3 = getRegistryHub();
  iVar2 = (*pIVar3->_vptr_IRegistryHub[3])(pIVar3);
  (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x18))
            ((long *)CONCAT44(extraout_var_01,iVar2),local_d8,config,auStack_78,0);
  pTVar1 = matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pcVar5 = (pointer)0x0;
  for (_str = auStack_78; _str != (undefined1  [8])pTVar1;
      _str = (undefined1  [8])((long)_str + 0x118)) {
    local_58[0].m_moved = false;
    Colour::use((int)((((pointer)_str)->super_TestCaseInfo).properties << 0x1e) >> 0x1f & FileName);
    Tbc::Text::Text((Text *)local_148,(string *)_str,(TextAttributes *)local_98);
    poVar4 = Tbc::operator<<((ostream *)&std::cout,(Text *)local_148);
    std::endl<char,std::char_traits<char>>(poVar4);
    Tbc::Text::~Text((Text *)local_148);
    if ((((pointer)_str)->super_TestCaseInfo).tags._M_t._M_impl.super__Rb_tree_header._M_node_count
        != 0) {
      Tbc::Text::Text((Text *)local_148,&(((pointer)_str)->super_TestCaseInfo).tagsAsString,
                      (TextAttributes *)
                      &testSpec.m_filters.
                       super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      poVar4 = Tbc::operator<<((ostream *)&std::cout,(Text *)local_148);
      std::endl<char,std::char_traits<char>>(poVar4);
      Tbc::Text::~Text((Text *)local_148);
    }
    Colour::~Colour(local_58);
    pcVar5 = pcVar5 + 1;
  }
  iVar2 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])();
  local_148._0_8_ = pcVar5;
  if (*(long *)CONCAT44(extraout_var_02,iVar2) == ((long *)CONCAT44(extraout_var_02,iVar2))[1]) {
    std::__cxx11::string::string((string *)local_58,"test case",&local_31);
    std::__cxx11::string::string((string *)(local_148 + 8),(string *)local_58);
    operator<<((ostream *)&std::cout,(pluralise *)local_148);
    poVar4 = std::operator<<((ostream *)&std::cout,"\n");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    std::__cxx11::string::string((string *)local_58,"matching test case",&local_31);
    std::__cxx11::string::string((string *)(local_148 + 8),(string *)local_58);
    operator<<((ostream *)&std::cout,(pluralise *)local_148);
    poVar4 = std::operator<<((ostream *)&std::cout,"\n");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::__cxx11::string::~string((string *)(local_148 + 8));
  std::__cxx11::string::~string((string *)local_58);
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)auStack_78);
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)local_d8);
  return (size_t)pcVar5;
}

Assistant:

inline std::size_t listTests( Config const& config ) {

        TestSpec testSpec = config.testSpec();
        if( config.testSpec().hasFilters() )
            Catch::cout() << "Matching test cases:\n";
        else {
            Catch::cout() << "All available test cases:\n";
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "*" ).testSpec();
        }

        std::size_t matchedTests = 0;
        TextAttributes nameAttr, tagsAttr;
        nameAttr.setInitialIndent( 2 ).setIndent( 4 );
        tagsAttr.setIndent( 6 );

        std::vector<TestCase> matchedTestCases;
        getRegistryHub().getTestCaseRegistry().getFilteredTests( testSpec, config, matchedTestCases );
        for( std::vector<TestCase>::const_iterator it = matchedTestCases.begin(), itEnd = matchedTestCases.end();
                it != itEnd;
                ++it ) {
            matchedTests++;
            TestCaseInfo const& testCaseInfo = it->getTestCaseInfo();
            Colour::Code colour = testCaseInfo.isHidden()
                ? Colour::SecondaryText
                : Colour::None;
            Colour colourGuard( colour );

            Catch::cout() << Text( testCaseInfo.name, nameAttr ) << std::endl;
            if( !testCaseInfo.tags.empty() )
                Catch::cout() << Text( testCaseInfo.tagsAsString, tagsAttr ) << std::endl;
        }

        if( !config.testSpec().hasFilters() )
            Catch::cout() << pluralise( matchedTests, "test case" ) << "\n" << std::endl;
        else
            Catch::cout() << pluralise( matchedTests, "matching test case" ) << "\n" << std::endl;
        return matchedTests;
    }